

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typesystem_parser.cpp
# Opt level: O0

void __thiscall franca::TypeDefinitionParser::TypeDefinitionParser(TypeDefinitionParser *this)

{
  bool_<false> local_2af3;
  expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::char_code<boost::spirit::tag::char_,_boost::spirit::char_encoding::standard>,_boost::fusion::vector<char>_>_>,_0L>
  local_2af2;
  expr<boost::proto::tagns_::tag::bitwise_or,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::alnum,_boost::spirit::char_encoding::standard>_>,_0L>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::char_code<boost::spirit::tag::char_,_boost::spirit::char_encoding::standard>,_boost::fusion::vector<char>_>_>,_0L>_&>,_2L>
  local_2af0;
  expr<boost::proto::tagns_::tag::dereference,_boost::proto::argsns_::list1<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::bitwise_or,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::alnum,_boost::spirit::char_encoding::standard>_>,_0L>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::char_code<boost::spirit::tag::char_,_boost::spirit::char_encoding::standard>,_boost::fusion::vector<char>_>_>,_0L>_&>,_2L>_&>,_1L>
  local_2ae0;
  bool_<false> local_2ad3;
  expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::char_code<boost::spirit::tag::char_,_boost::spirit::char_encoding::standard>,_boost::fusion::vector<char>_>_>,_0L>
  local_2ad2;
  expr<boost::proto::tagns_::tag::bitwise_or,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::alpha,_boost::spirit::char_encoding::standard>_>,_0L>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::char_code<boost::spirit::tag::char_,_boost::spirit::char_encoding::standard>,_boost::fusion::vector<char>_>_>,_0L>_&>,_2L>
  local_2ad0;
  bool_<false> local_2abb;
  expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::lit,_boost::fusion::vector<char>_>_>,_0L>
  local_2aba;
  expr<boost::proto::tagns_::tag::negate,_boost::proto::argsns_::list1<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::lit,_boost::fusion::vector<char>_>_>,_0L>_&>,_1L>
  local_2ab8;
  expr<boost::proto::tagns_::tag::shift_right,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::negate,_boost::proto::argsns_::list1<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::lit,_boost::fusion::vector<char>_>_>,_0L>_&>,_1L>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::bitwise_or,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::alpha,_boost::spirit::char_encoding::standard>_>,_0L>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::char_code<boost::spirit::tag::char_,_boost::spirit::char_encoding::standard>,_boost::fusion::vector<char>_>_>,_0L>_&>,_2L>_&>,_2L>
  local_2ab0;
  expr<boost::proto::tagns_::tag::shift_right,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_right,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::negate,_boost::proto::argsns_::list1<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::lit,_boost::fusion::vector<char>_>_>,_0L>_&>,_1L>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::bitwise_or,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::alpha,_boost::spirit::char_encoding::standard>_>,_0L>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::char_code<boost::spirit::tag::char_,_boost::spirit::char_encoding::standard>,_boost::fusion::vector<char>_>_>,_0L>_&>,_2L>_&>,_2L>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::dereference,_boost::proto::argsns_::list1<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::bitwise_or,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::alnum,_boost::spirit::char_encoding::standard>_>,_0L>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::char_code<boost::spirit::tag::char_,_boost::spirit::char_encoding::standard>,_boost::fusion::vector<char>_>_>,_0L>_&>,_2L>_&>,_1L>_&>,_2L>
  local_2aa0;
  expr<_25b96702_> local_2a90;
  undefined1 local_2a79;
  undefined1 local_2a78 [16];
  undefined1 local_2a68 [23];
  char local_2a51;
  expr<boost::proto::tagns_::tag::greater,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_&>,_0L>,_franca::ExpressionParser_&>,_2L>
  local_2a50;
  expr<boost::proto::tagns_::tag::negate,_boost::proto::argsns_::list1<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::greater,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_&>,_0L>,_franca::ExpressionParser_&>,_2L>_&>,_1L>
  local_2a40;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  local_2a38;
  bool_<false> local_2a26;
  terminal<boost::spirit::tag::lit> local_2a25 [2];
  bool_<false> local_2a23;
  terminal<boost::spirit::tag::lit> local_2a22 [2];
  undefined1 local_2a20 [24];
  extends<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::qi::reference<const_boost::spirit::qi::rule<const_char_*,_franca::SkipGrammar,_boost::variant<fidler::ast::BuiltinType,_fidler::ast::IntegerInterval,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(),_boost::spirit::unused_type,_boost::spirit::unused_type>_>_>,_0L>,_boost::spirit::qi::grammar<const_char_*,_franca::SkipGrammar,_boost::variant<fidler::ast::BuiltinType,_fidler::ast::IntegerInterval,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(),_boost::spirit::unused_type,_boost::spirit::unused_type>,_boost::proto::domainns_::default_domain,_0L>
  local_2a08;
  TypeParser *local_2a00;
  proto_child0 local_29f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  local_29f0;
  char local_29da [2];
  char *local_29d8;
  Rule<std::string_()> *local_29d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  local_29c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  *local_29b8;
  function_buffer local_29b0;
  expr<boost::proto::tagns_::tag::greater,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::greater,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::greater,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::greater,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::greater,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[4]>,_0L>,_boost::spirit::qi::rule<const_char_*,_franca::SkipGrammar,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_boost::spirit::unused_type,_boost::spirit::unused_type>_&>,_2L>_&,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_&>,_0L>_>,_2L>_&,_franca::TypeParser_&>,_2L>_&,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[3]>,_0L>_>,_2L>_&,_franca::TypeParser_&>,_2L>
  local_2998;
  undefined1 local_2988 [23];
  char local_2971;
  Rule<ast::Field_()> *local_2970;
  undefined1 local_2961;
  undefined1 local_2960 [16];
  vtable_base local_2950;
  char *local_2948;
  Rule<std::string_()> *local_2940;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  local_2938;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  *local_2928;
  function_buffer local_2920;
  expr<boost::proto::tagns_::tag::greater,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::greater,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::greater,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::greater,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::greater,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[6]>,_0L>,_boost::spirit::qi::rule<const_char_*,_franca::SkipGrammar,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_boost::spirit::unused_type,_boost::spirit::unused_type>_&>,_2L>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::negate,_boost::proto::argsns_::list1<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::greater,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[8]>,_0L>,_boost::spirit::qi::rule<const_char_*,_franca::SkipGrammar,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_boost::spirit::unused_type,_boost::spirit::unused_type>_&>,_2L>_&>,_1L>_&>,_2L>_&,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_&>,_0L>_>,_2L>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::dereference,_boost::proto::argsns_::list1<boost::spirit::qi::rule<const_char_*,_franca::SkipGrammar,_fidler::ast::Field_(),_boost::spirit::unused_type,_boost::spirit::unused_type>_&>,_1L>_&>,_2L>_&,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_&>,_0L>_>,_2L>
  local_2908;
  char local_28f1;
  expr<boost::proto::tagns_::tag::dereference,_boost::proto::argsns_::list1<boost::spirit::qi::rule<const_char_*,_franca::SkipGrammar,_fidler::ast::Field_(),_boost::spirit::unused_type,_boost::spirit::unused_type>_&>,_1L>
  local_28f0;
  undefined1 local_28e1;
  undefined1 *local_28e0;
  char *local_28d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  local_28d0;
  vtable_base local_28c0;
  char *local_28b8;
  Rule<std::string_()> *local_28b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  local_28a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  *local_2898;
  function_buffer local_2890;
  expr<_afc8918c_> local_2878;
  undefined1 local_2868 [23];
  char local_2851;
  function_buffer local_2850;
  undefined8 local_2838;
  extends<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::qi::reference<const_boost::spirit::qi::rule<const_char_*,_franca::SkipGrammar,_fidler::ast::Expression_(),_boost::spirit::unused_type,_boost::spirit::unused_type>_>_>,_0L>,_boost::spirit::qi::grammar<const_char_*,_franca::SkipGrammar,_fidler::ast::Expression_(),_boost::spirit::unused_type,_boost::spirit::unused_type>,_boost::proto::domainns_::default_domain,_0L>
  local_2830;
  char *local_2828;
  Rule<std::string_()> *local_2820;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  local_2818;
  extends<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::qi::reference<const_boost::spirit::qi::rule<const_char_*,_franca::SkipGrammar,_fidler::ast::Expression_(),_boost::spirit::unused_type,_boost::spirit::unused_type>_>_>,_0L>,_boost::spirit::qi::rule<const_char_*,_franca::SkipGrammar,_fidler::ast::Expression_(),_boost::spirit::unused_type,_boost::spirit::unused_type>,_boost::proto::domainns_::default_domain,_0L>
  local_2808;
  char *local_2800;
  undefined1 local_27f8 [16];
  expr<boost::proto::tagns_::tag::greater,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::greater,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::greater,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::greater,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::greater,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[12]>,_0L>,_boost::spirit::qi::rule<const_char_*,_franca::SkipGrammar,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_boost::spirit::unused_type,_boost::spirit::unused_type>_&>,_2L>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::negate,_boost::proto::argsns_::list1<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::greater,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[8]>,_0L>,_boost::spirit::qi::rule<const_char_*,_franca::SkipGrammar,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_boost::spirit::unused_type,_boost::spirit::unused_type>_&>,_2L>_&>,_1L>_&>,_2L>_&,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_&>,_0L>_>,_2L>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::dereference,_boost::proto::argsns_::list1<boost::spirit::qi::rule<const_char_*,_franca::SkipGrammar,_fidler::ast::Enumerator_(),_boost::spirit::unused_type,_boost::spirit::unused_type>_&>,_1L>_&>,_2L>_&,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_&>,_0L>_>,_2L>
  local_27e8;
  undefined1 local_27d8 [24];
  extends<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::qi::reference<const_boost::spirit::qi::rule<const_char_*,_franca::SkipGrammar,_std::pair<fidler::ast::Expression,_fidler::ast::Expression>_(),_boost::spirit::unused_type,_boost::spirit::unused_type>_>_>,_0L>,_boost::spirit::qi::rule<const_char_*,_franca::SkipGrammar,_std::pair<fidler::ast::Expression,_fidler::ast::Expression>_(),_boost::spirit::unused_type,_boost::spirit::unused_type>,_boost::proto::domainns_::default_domain,_0L>
  local_27c0;
  expr<boost::proto::tagns_::tag::greater,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::greater,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::greater,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[8]>,_0L>,_boost::spirit::qi::rule<const_char_*,_franca::SkipGrammar,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_boost::spirit::unused_type,_boost::spirit::unused_type>_&>,_2L>_&,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[3]>,_0L>_>,_2L>_&,_franca::TypeParser_&>,_2L>
  local_27b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  local_27a8;
  undefined1 local_2798 [16];
  expr<boost::proto::tagns_::tag::greater,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::greater,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::greater,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[6]>,_0L>,_boost::spirit::qi::rule<const_char_*,_franca::SkipGrammar,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_boost::spirit::unused_type,_boost::spirit::unused_type>_&>,_2L>_&,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[3]>,_0L>_>,_2L>_&,_franca::TypeParser_&>,_2L>
  local_2788;
  extends<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::qi::reference<const_boost::spirit::qi::rule<const_char_*,_franca::SkipGrammar,_fidler::ast::Identifier_(),_boost::spirit::unused_type,_boost::spirit::unused_type>_>_>,_0L>,_boost::spirit::qi::rule<const_char_*,_franca::SkipGrammar,_fidler::ast::Identifier_(),_boost::spirit::unused_type,_boost::spirit::unused_type>,_boost::proto::domainns_::default_domain,_0L>
  local_2778;
  Rule<ast::EnumerationType_()> *local_2770;
  extends<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::qi::reference<const_boost::spirit::qi::rule<const_char_*,_franca::SkipGrammar,_fidler::ast::Identifier_(),_boost::spirit::unused_type,_boost::spirit::unused_type>_>_>,_0L>,_boost::spirit::qi::rule<const_char_*,_franca::SkipGrammar,_fidler::ast::Identifier_(),_boost::spirit::unused_type,_boost::spirit::unused_type>,_boost::proto::domainns_::default_domain,_0L>
  *local_2768;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  local_2760;
  Rule<ast::UnionType_()> *local_2750;
  undefined1 local_2748 [24];
  extends<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::qi::reference<const_boost::spirit::qi::rule<const_char_*,_franca::SkipGrammar,_fidler::ast::CurrentError_(),_boost::spirit::unused_type,_boost::spirit::unused_type>_>_>,_0L>,_boost::spirit::qi::rule<const_char_*,_franca::SkipGrammar,_fidler::ast::CurrentError_(),_boost::spirit::unused_type,_boost::spirit::unused_type>,_boost::proto::domainns_::default_domain,_0L>
  local_2730;
  allocator local_2721;
  string local_2720;
  allocator local_26f9;
  string local_26f8;
  allocator local_26d1;
  string local_26d0;
  allocator local_26a9;
  string local_26a8;
  allocator local_2681;
  string local_2680;
  allocator local_2659;
  string local_2658;
  allocator local_2631;
  string local_2630;
  allocator local_2609;
  string local_2608;
  allocator local_25e1;
  string local_25e0;
  allocator local_25b9;
  string local_25b8;
  allocator local_2591;
  string local_2590;
  allocator local_2559;
  string local_2558;
  extends<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::qi::reference<const_boost::spirit::qi::rule<const_char_*,_franca::SkipGrammar,_fidler::ast::OperatorExpression<fidler::ast::AdditiveOperator,_fidler::ast::OperatorExpression<fidler::ast::MultiplicativeOperator,_fidler::ast::PrefixExpression>_>_(),_boost::spirit::unused_type,_boost::spirit::unused_type>_>_>,_0L>,_boost::spirit::qi::rule<const_char_*,_franca::SkipGrammar,_fidler::ast::OperatorExpression<fidler::ast::AdditiveOperator,_fidler::ast::OperatorExpression<fidler::ast::MultiplicativeOperator,_fidler::ast::PrefixExpression>_>_(),_boost::spirit::unused_type,_boost::spirit::unused_type>,_boost::proto::domainns_::default_domain,_0L>
  local_2538;
  TypeDefinitionParser *this_local;
  undefined1 *local_2528;
  undefined1 local_2520 [8];
  expr<boost::proto::tagns_::tag::subscript,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::raw>,_0L>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::modulus,_boost::proto::argsns_::list2<boost::spirit::qi::rule<const_char_*,_franca::SkipGrammar,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_boost::spirit::unused_type,_boost::spirit::unused_type>_&,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_&>,_0L>_>,_2L>_&>,_2L>
  that_74;
  expr<boost::proto::tagns_::tag::subscript,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::matches>,_0L>_&,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[12]>,_0L>_>,_2L>
  that_33;
  expr<boost::proto::tagns_::tag::subscript,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::matches>,_0L>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::greater,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::lit,_boost::fusion::vector<char>_>_>,_0L>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::lit,_boost::fusion::vector<char>_>_>,_0L>_&>,_2L>_&>,_2L>
  that_65;
  expr<_25b96702_> that_81;
  expr_type that_72;
  expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_&>,_0L> that_73;
  undefined1 local_1bf9;
  TypeDefinitionParser *local_1bf8;
  TypeDefinitionParser *local_1bf0;
  undefined1 *local_1be8;
  expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::lit,_boost::fusion::vector<char>_>_>,_0L>
  *local_1bd8;
  expr_type that_75;
  expr_type that;
  expr_type that_1;
  expr_type that_2;
  expr_type that_3;
  expr_type that_4;
  expr_type that_5;
  expr_type that_42;
  expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[6]>,_0L>
  that_43;
  expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[6]>,_0L>
  that_6;
  expr_type that_7;
  expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[3]>,_0L>
  that_8;
  expr_type that_9;
  expr_type that_10;
  expr_type that_17;
  expr_type that_29;
  expr_type that_44;
  expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[8]>,_0L>
  that_45;
  expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[8]>,_0L>
  that_30;
  expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[8]>,_0L>
  that_18;
  expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[8]>,_0L>
  that_11;
  expr_type that_12;
  expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[3]>,_0L>
  that_13;
  expr_type that_14;
  expr_type that_15;
  expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[12]>,_0L>
  that_16;
  expr_type that_19;
  expr_type that_31;
  expr_type that_46;
  expr_type that_20;
  expr_type that_21;
  expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_&>,_0L> that_22;
  expr_type that_23;
  expr_type that_24;
  expr_type that_25;
  expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_&>,_0L> that_26;
  expr_type that_27;
  expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[7]>,_0L>
  that_28;
  expr_type that_32;
  undefined1 local_e11;
  char *local_e10;
  char *local_e08;
  char *local_e00;
  undefined1 *local_df8;
  char *local_df0;
  char *local_de8;
  char *local_de0;
  undefined8 local_dd8;
  undefined8 local_dd0;
  char *local_dc8;
  char *local_dc0;
  expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[12]>,_0L>
  that_34;
  expr_type that_35;
  expr_type that_36;
  expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_&>,_0L> that_37;
  expr_type that_38;
  expr_type that_50;
  expr_type that_39;
  expr_type that_40;
  expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_&>,_0L> that_41;
  expr_type that_47;
  expr_type that_48;
  expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_&>,_0L> that_49;
  expr_type that_51;
  expr_type that_52;
  expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_&>,_0L> that_53;
  expr_type that_54;
  expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[4]>,_0L>
  that_55;
  expr_type that_56;
  expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_&>,_0L> that_57;
  expr_type that_58;
  expr_type that_59;
  expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[3]>,_0L>
  that_60;
  expr_type that_61;
  expr_type that_62;
  expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_&>,_0L> that_63;
  expr_type that_64;
  undefined1 local_491;
  proto_child0 local_490;
  proto_child0 local_488;
  undefined1 *local_480;
  TypeParser *pTStack_470;
  expr_type that_66;
  expr_type that_67;
  expr_type that_68;
  expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_&>,_0L> that_69;
  expr_type that_70;
  expr_type that_71;
  expr_type that_76;
  expr_type that_77;
  expr_type that_78;
  expr_type that_79;
  expr_type that_80;
  undefined1 local_21;
  expr<boost::proto::tagns_::tag::shift_right,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_right,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::negate,_boost::proto::argsns_::list1<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::lit,_boost::fusion::vector<char>_>_>,_0L>_&>,_1L>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::bitwise_or,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::alpha,_boost::spirit::char_encoding::standard>_>,_0L>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::char_code<boost::spirit::tag::char_,_boost::spirit::char_encoding::standard>,_boost::fusion::vector<char>_>_>,_0L>_&>,_2L>_&>,_2L>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::dereference,_boost::proto::argsns_::list1<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::bitwise_or,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::alnum,_boost::spirit::char_encoding::standard>_>,_0L>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::char_code<boost::spirit::tag::char_,_boost::spirit::char_encoding::standard>,_boost::fusion::vector<char>_>_>,_0L>_&>,_2L>_&>,_1L>_&>,_2L>
  *local_20;
  expr<boost::proto::tagns_::tag::shift_right,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_right,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::negate,_boost::proto::argsns_::list1<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::lit,_boost::fusion::vector<char>_>_>,_0L>_&>,_1L>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::bitwise_or,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::alpha,_boost::spirit::char_encoding::standard>_>,_0L>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::char_code<boost::spirit::tag::char_,_boost::spirit::char_encoding::standard>,_boost::fusion::vector<char>_>_>,_0L>_&>,_2L>_&>,_2L>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::dereference,_boost::proto::argsns_::list1<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::bitwise_or,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::alnum,_boost::spirit::char_encoding::standard>_>,_0L>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::char_code<boost::spirit::tag::char_,_boost::spirit::char_encoding::standard>,_boost::fusion::vector<char>_>_>,_0L>_&>,_2L>_&>,_1L>_&>,_2L>
  *local_18;
  undefined1 *local_10;
  
  local_2538.proto_expr_.child0.ref.t_ =
       (expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::qi::reference<const_boost::spirit::qi::rule<const_char_*,_franca::SkipGrammar,_fidler::ast::OperatorExpression<fidler::ast::AdditiveOperator,_fidler::ast::OperatorExpression<fidler::ast::MultiplicativeOperator,_fidler::ast::PrefixExpression>_>_(),_boost::spirit::unused_type,_boost::spirit::unused_type>_>_>,_0L>
        )(expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::qi::reference<const_boost::spirit::qi::rule<const_char_*,_franca::SkipGrammar,_fidler::ast::OperatorExpression<fidler::ast::AdditiveOperator,_fidler::ast::OperatorExpression<fidler::ast::MultiplicativeOperator,_fidler::ast::PrefixExpression>_>_(),_boost::spirit::unused_type,_boost::spirit::unused_type>_>_>,_0L>
          )this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_2558,"unnamed-grammar",&local_2559);
  boost::spirit::qi::
  grammar<const_char_*,_franca::SkipGrammar,_boost::variant<fidler::ast::ArrayType,_fidler::ast::EnumerationType,_fidler::ast::StructType,_fidler::ast::UnionType,_fidler::ast::MapType,_fidler::ast::AliasType>_(),_boost::spirit::unused_type,_boost::spirit::unused_type>
  ::grammar(&this->
             super_grammar<const_char_*,_franca::SkipGrammar,_boost::variant<fidler::ast::ArrayType,_fidler::ast::EnumerationType,_fidler::ast::StructType,_fidler::ast::UnionType,_fidler::ast::MapType,_fidler::ast::AliasType>_(),_boost::spirit::unused_type,_boost::spirit::unused_type>
            ,&this->type_definition_,&local_2558);
  std::__cxx11::string::~string((string *)&local_2558);
  std::allocator<char>::~allocator((allocator<char> *)&local_2559);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_2590,"unnamed-rule",&local_2591);
  boost::spirit::qi::
  rule<const_char_*,_franca::SkipGrammar,_boost::variant<fidler::ast::ArrayType,_fidler::ast::EnumerationType,_fidler::ast::StructType,_fidler::ast::UnionType,_fidler::ast::MapType,_fidler::ast::AliasType>_(),_boost::spirit::unused_type,_boost::spirit::unused_type>
  ::rule(&this->type_definition_,&local_2590);
  std::__cxx11::string::~string((string *)&local_2590);
  std::allocator<char>::~allocator((allocator<char> *)&local_2591);
  TypeParser::TypeParser(&this->type_);
  ExpressionParser::ExpressionParser(&this->expression_);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_25b8,"unnamed-rule",&local_25b9);
  boost::spirit::qi::
  rule<const_char_*,_franca::SkipGrammar,_fidler::ast::ArrayType_(),_boost::spirit::unused_type,_boost::spirit::unused_type>
  ::rule(&this->array_type_,&local_25b8);
  std::__cxx11::string::~string((string *)&local_25b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_25b9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_25e0,"unnamed-rule",&local_25e1);
  boost::spirit::qi::
  rule<const_char_*,_franca::SkipGrammar,_fidler::ast::EnumerationType_(),_boost::spirit::unused_type,_boost::spirit::unused_type>
  ::rule(&this->enumeration_type_,&local_25e0);
  std::__cxx11::string::~string((string *)&local_25e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_25e1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_2608,"unnamed-rule",&local_2609);
  boost::spirit::qi::
  rule<const_char_*,_franca::SkipGrammar,_fidler::ast::StructType_(),_boost::spirit::unused_type,_boost::spirit::unused_type>
  ::rule(&this->struct_type_,&local_2608);
  std::__cxx11::string::~string((string *)&local_2608);
  std::allocator<char>::~allocator((allocator<char> *)&local_2609);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_2630,"unnamed-rule",&local_2631);
  boost::spirit::qi::
  rule<const_char_*,_franca::SkipGrammar,_fidler::ast::UnionType_(),_boost::spirit::unused_type,_boost::spirit::unused_type>
  ::rule(&this->union_type_,&local_2630);
  std::__cxx11::string::~string((string *)&local_2630);
  std::allocator<char>::~allocator((allocator<char> *)&local_2631);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_2658,"unnamed-rule",&local_2659);
  boost::spirit::qi::
  rule<const_char_*,_franca::SkipGrammar,_fidler::ast::MapType_(),_boost::spirit::unused_type,_boost::spirit::unused_type>
  ::rule(&this->map_type_,&local_2658);
  std::__cxx11::string::~string((string *)&local_2658);
  std::allocator<char>::~allocator((allocator<char> *)&local_2659);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_2680,"unnamed-rule",&local_2681);
  boost::spirit::qi::
  rule<const_char_*,_franca::SkipGrammar,_fidler::ast::AliasType_(),_boost::spirit::unused_type,_boost::spirit::unused_type>
  ::rule(&this->alias_type_,&local_2680);
  std::__cxx11::string::~string((string *)&local_2680);
  std::allocator<char>::~allocator((allocator<char> *)&local_2681);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_26a8,"unnamed-rule",&local_26a9);
  boost::spirit::qi::
  rule<const_char_*,_franca::SkipGrammar,_fidler::ast::Enumerator_(),_boost::spirit::unused_type,_boost::spirit::unused_type>
  ::rule(&this->enumerator_,&local_26a8);
  std::__cxx11::string::~string((string *)&local_26a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_26a9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_26d0,"unnamed-rule",&local_26d1);
  boost::spirit::qi::
  rule<const_char_*,_franca::SkipGrammar,_fidler::ast::Field_(),_boost::spirit::unused_type,_boost::spirit::unused_type>
  ::rule(&this->field_,&local_26d0);
  std::__cxx11::string::~string((string *)&local_26d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_26d1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_26f8,"unnamed-rule",&local_26f9);
  boost::spirit::qi::
  rule<const_char_*,_franca::SkipGrammar,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_boost::spirit::unused_type,_boost::spirit::unused_type>
  ::rule(&this->fqn_,&local_26f8);
  std::__cxx11::string::~string((string *)&local_26f8);
  std::allocator<char>::~allocator((allocator<char> *)&local_26f9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_2720,"unnamed-rule",&local_2721);
  boost::spirit::qi::
  rule<const_char_*,_franca::SkipGrammar,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_boost::spirit::unused_type,_boost::spirit::unused_type>
  ::rule(&this->id_,&local_2720);
  std::__cxx11::string::~string((string *)&local_2720);
  std::allocator<char>::~allocator((allocator<char> *)&local_2721);
  local_2778.proto_expr_.child0.ref.t_ =
       (expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::qi::reference<const_boost::spirit::qi::rule<const_char_*,_franca::SkipGrammar,_fidler::ast::Identifier_(),_boost::spirit::unused_type,_boost::spirit::unused_type>_>_>,_0L>
        )&this->array_type_;
  local_2770 = &this->enumeration_type_;
  local_2760._M_allocated_capacity = (size_type)&this->struct_type_;
  local_2768 = &local_2778;
  local_2750 = &this->union_type_;
  local_2760._8_8_ = &local_2768;
  local_2748._8_8_ = &this->map_type_;
  local_2748._0_8_ = local_2760._M_local_buf + 8;
  local_2730.proto_expr_.child0.ref.t_ =
       (expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::qi::reference<const_boost::spirit::qi::rule<const_char_*,_franca::SkipGrammar,_fidler::ast::CurrentError_(),_boost::spirit::unused_type,_boost::spirit::unused_type>_>_>,_0L>
        )&this->alias_type_;
  local_2748._16_8_ = local_2748;
  boost::spirit::qi::operator%=
            (&this->type_definition_,
             (expr<boost::proto::tagns_::tag::bitwise_or,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::bitwise_or,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::bitwise_or,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::bitwise_or,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::bitwise_or,_boost::proto::argsns_::list2<boost::spirit::qi::rule<const_char_*,_franca::SkipGrammar,_fidler::ast::ArrayType_(),_boost::spirit::unused_type,_boost::spirit::unused_type>_&,_boost::spirit::qi::rule<const_char_*,_franca::SkipGrammar,_fidler::ast::EnumerationType_(),_boost::spirit::unused_type,_boost::spirit::unused_type>_&>,_2L>_&,_boost::spirit::qi::rule<const_char_*,_franca::SkipGrammar,_fidler::ast::StructType_(),_boost::spirit::unused_type,_boost::spirit::unused_type>_&>,_2L>_&,_boost::spirit::qi::rule<const_char_*,_franca::SkipGrammar,_fidler::ast::UnionType_(),_boost::spirit::unused_type,_boost::spirit::unused_type>_&>,_2L>_&,_boost::spirit::qi::rule<const_char_*,_franca::SkipGrammar,_fidler::ast::MapType_(),_boost::spirit::unused_type,_boost::spirit::unused_type>_&>,_2L>_&,_boost::spirit::qi::rule<const_char_*,_franca::SkipGrammar,_fidler::ast::AliasType_(),_boost::spirit::unused_type,_boost::spirit::unused_type>_&>,_2L>
              *)(local_2748 + 0x10));
  local_27a8._8_8_ = &this->id_;
  local_27a8._M_allocated_capacity = (size_type)"array";
  local_2798._0_8_ = &local_27a8;
  local_2798._8_8_ = "of";
  local_2788.child1 = &this->type_;
  local_2788.child0 = (proto_child0)local_2798;
  boost::spirit::qi::operator%=(&this->array_type_,&local_2788);
  local_27d8._8_8_ = &this->id_;
  local_27d8._0_8_ = "typedef";
  local_27d8._16_8_ = local_27d8;
  local_27c0.proto_expr_.child0.ref.t_ =
       (expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::qi::reference<const_boost::spirit::qi::rule<const_char_*,_franca::SkipGrammar,_std::pair<fidler::ast::Expression,_fidler::ast::Expression>_(),_boost::spirit::unused_type,_boost::spirit::unused_type>_>_>,_0L>
        )(proto_child0)0x147b528;
  local_27b8.child1 = &this->type_;
  local_27b8.child0 = (proto_child0)(local_27d8 + 0x10);
  boost::spirit::qi::operator%=(&this->alias_type_,&local_27b8);
  local_2820 = &this->id_;
  local_2828 = "enumeration";
  local_2838 = &this->fqn_;
  local_2850._16_8_ = "extends";
  local_2830.proto_expr_.child0.ref.t_ =
       (expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::qi::reference<const_boost::spirit::qi::rule<const_char_*,_franca::SkipGrammar,_fidler::ast::Expression_(),_boost::spirit::unused_type,_boost::spirit::unused_type>_>_>,_0L>
        )((long)local_2850.data + 0x10);
  local_2818._M_allocated_capacity = (size_type)&local_2828;
  local_2818._8_8_ = &local_2830;
  local_2850.data[0xf] = '{';
  local_2808.proto_expr_.child0.ref.t_ =
       (expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::qi::reference<const_boost::spirit::qi::rule<const_char_*,_franca::SkipGrammar,_fidler::ast::Expression_(),_boost::spirit::unused_type,_boost::spirit::unused_type>_>_>,_0L>
        )&local_2818;
  local_2800 = local_2850.data + 0xf;
  local_2850.members.obj_ptr = &this->enumerator_;
  local_27f8._0_8_ = &local_2808;
  local_27f8._8_8_ = &local_2850;
  local_2851 = '}';
  local_27e8.child0 = (proto_child0)local_27f8;
  local_27e8.child1.child0 = &local_2851;
  boost::spirit::qi::operator%=(&this->enumeration_type_,&local_27e8);
  local_28b0 = &this->id_;
  local_28b8 = "struct";
  local_28d0._8_8_ = &this->fqn_;
  local_28d0._M_allocated_capacity = (size_type)"extends";
  local_28c0.manager =
       (_func_void_function_buffer_ptr_function_buffer_ptr_functor_manager_operation_type *)
       &local_28d0;
  local_28a8._M_allocated_capacity = (size_type)&local_28b8;
  local_28a8._8_8_ = &local_28c0;
  local_e10 = "polymorphic";
  local_df8 = &local_e11;
  local_e00 = "polymorphic";
  local_de8 = "polymorphic";
  local_dc8 = "polymorphic";
  local_dd0 = 0;
  local_dd8 = 0;
  local_dc0 = "polymorphic";
  local_de0 = "polymorphic";
  local_df0 = "polymorphic";
  local_e08 = "polymorphic";
  local_28e0 = &boost::spirit::matches;
  local_28d8 = "polymorphic";
  local_2898 = &local_28a8;
  local_2890.members.obj_ptr = &local_28e0;
  local_28e1 = 0x7b;
  local_2890._8_8_ = &local_2898;
  local_2890._16_8_ = &local_28e1;
  local_28f0.child0 = &this->field_;
  local_2878.child0 = (proto_child0)((long)local_2890.data + 8);
  local_2878.child1 = &local_28f0;
  local_28f1 = '}';
  local_2868._0_8_ = &local_2878;
  local_2868._8_8_ = &local_28f1;
  boost::spirit::qi::operator%=(&this->struct_type_,(expr<_9091ae92_> *)local_2868);
  local_2940 = &this->id_;
  local_2948 = "union";
  local_2960._8_8_ = &this->fqn_;
  local_2960._0_8_ = "extends";
  local_2950.manager =
       (_func_void_function_buffer_ptr_function_buffer_ptr_functor_manager_operation_type *)
       local_2960;
  local_2938._M_allocated_capacity = (size_type)&local_2948;
  local_2938._8_8_ = &local_2950;
  local_2961 = '{';
  local_2928 = &local_2938;
  local_2920.members.obj_ptr = &local_2961;
  local_2970 = &this->field_;
  local_2920._8_8_ = &local_2928;
  local_2920._16_8_ = &local_2970;
  local_2971 = '}';
  local_2908.child0 = (proto_child0)((long)local_2920.data + 8);
  local_2908.child1.child0 = &local_2971;
  boost::spirit::qi::operator%=(&this->union_type_,&local_2908);
  local_29d0 = &this->id_;
  local_29d8 = "map";
  local_29da[1] = 0x7b;
  local_29c8._M_allocated_capacity = (size_type)&local_29d8;
  local_29c8._8_8_ = local_29da + 1;
  local_29b0.members.obj_ptr = &this->type_;
  local_29b8 = &local_29c8;
  local_29b0._8_8_ = &local_29b8;
  local_29b0._16_8_ = "to";
  local_2998.child1 = &this->type_;
  local_2998.child0 = (proto_child0)((long)local_29b0.data + 8);
  local_29da[0] = '}';
  local_2988._0_8_ = &local_2998;
  local_2988._8_8_ = local_29da;
  boost::spirit::qi::operator%=
            (&this->map_type_,
             (expr<boost::proto::tagns_::tag::greater,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::greater,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::greater,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::greater,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::greater,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::greater,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[4]>,_0L>,_boost::spirit::qi::rule<const_char_*,_franca::SkipGrammar,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_boost::spirit::unused_type,_boost::spirit::unused_type>_&>,_2L>_&,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_&>,_0L>_>,_2L>_&,_franca::TypeParser_&>,_2L>_&,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[3]>,_0L>_>,_2L>_&,_franca::TypeParser_&>,_2L>_&,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_&>,_0L>_>,_2L>
              *)local_2988);
  local_2a23 = (bool_<false>)0x5b;
  boost::spirit::terminal<boost::spirit::tag::lit>::operator()
            (local_2a22,&boost::spirit::lit,&local_2a23);
  local_2a26 = (bool_<false>)0x5d;
  boost::spirit::terminal<boost::spirit::tag::lit>::operator()
            (local_2a25,&boost::spirit::lit,&local_2a26);
  local_2a20._0_8_ = local_2a22;
  local_2a20._8_8_ = local_2a25;
  local_2a08.proto_expr_.child0.ref.t_ =
       (expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::qi::reference<const_boost::spirit::qi::rule<const_char_*,_franca::SkipGrammar,_boost::variant<fidler::ast::BuiltinType,_fidler::ast::IntegerInterval,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(),_boost::spirit::unused_type,_boost::spirit::unused_type>_>_>,_0L>
        )local_2a20;
  local_480 = &local_491;
  local_2a20._16_8_ = &boost::spirit::matches;
  local_29f8 = (proto_child0)(local_2a20 + 0x10);
  local_29f0._8_8_ = &this->id_;
  local_29f0._M_allocated_capacity = (size_type)&local_2a00;
  local_2a00 = &this->type_;
  local_490.ref.t_ =
       (reference_wrapper<const_boost::spirit::qi::rule<const_char_*,_franca::SkipGrammar,_boost::variant<fidler::ast::BuiltinType,_fidler::ast::IntegerInterval,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(),_boost::spirit::unused_type,_boost::spirit::unused_type>_>
        )(reference_wrapper<const_boost::spirit::qi::rule<const_char_*,_franca::SkipGrammar,_boost::variant<fidler::ast::BuiltinType,_fidler::ast::IntegerInterval,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(),_boost::spirit::unused_type,_boost::spirit::unused_type>_>
          )local_2a08.proto_expr_.child0.ref.t_;
  local_488.ref.t_ =
       (reference_wrapper<const_boost::spirit::qi::rule<const_char_*,_franca::SkipGrammar,_boost::variant<fidler::ast::BuiltinType,_fidler::ast::IntegerInterval,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(),_boost::spirit::unused_type,_boost::spirit::unused_type>_>
        )(reference_wrapper<const_boost::spirit::qi::rule<const_char_*,_franca::SkipGrammar,_boost::variant<fidler::ast::BuiltinType,_fidler::ast::IntegerInterval,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(),_boost::spirit::unused_type,_boost::spirit::unused_type>_>
          )local_2a08.proto_expr_.child0.ref.t_;
  pTStack_470 = &this->type_;
  that_66.child0 = local_29f8;
  that_66.child1 = (proto_child1)local_29f8;
  boost::spirit::qi::operator%=
            (&this->field_,
             (expr<boost::proto::tagns_::tag::greater,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::greater,_boost::proto::argsns_::list2<franca::TypeParser_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::subscript,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::matches>,_0L>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::greater,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::lit,_boost::fusion::vector<char>_>_>,_0L>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::lit,_boost::fusion::vector<char>_>_>,_0L>_&>,_2L>_&>,_2L>_&>,_2L>_&,_boost::spirit::qi::rule<const_char_*,_franca::SkipGrammar,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_boost::spirit::unused_type,_boost::spirit::unused_type>_&>,_2L>
              *)&local_29f0);
  local_2a38._M_allocated_capacity = (size_type)&this->id_;
  local_2a51 = '=';
  local_2a50.child1 = &this->expression_;
  local_2a50.child0.child0 = &local_2a51;
  local_2a40.child0 = &local_2a50;
  local_2a38._8_8_ = &local_2a40;
  boost::spirit::qi::operator%=
            (&this->enumerator_,
             (expr<boost::proto::tagns_::tag::shift_right,_boost::proto::argsns_::list2<boost::spirit::qi::rule<const_char_*,_franca::SkipGrammar,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_boost::spirit::unused_type,_boost::spirit::unused_type>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::negate,_boost::proto::argsns_::list1<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::greater,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_&>,_0L>,_franca::ExpressionParser_&>,_2L>_&>,_1L>_&>,_2L>
              *)&local_2a38);
  local_2a78._0_8_ = &this->id_;
  local_2a79 = 0x2e;
  local_2a78._8_8_ = &local_2a79;
  local_2528 = &boost::spirit::raw;
  local_2a68._8_8_ = local_2a78;
  local_2520 = (undefined1  [8])&boost::spirit::raw;
  local_1be8 = &local_1bf9;
  local_2a68._0_8_ = &boost::spirit::raw;
  this_local = (TypeDefinitionParser *)local_2a68._8_8_;
  local_1bf8 = (TypeDefinitionParser *)local_2a68._8_8_;
  local_1bf0 = (TypeDefinitionParser *)local_2a68._8_8_;
  boost::spirit::qi::operator%=
            (&this->fqn_,
             (expr<boost::proto::tagns_::tag::subscript,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::raw>,_0L>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::modulus,_boost::proto::argsns_::list2<boost::spirit::qi::rule<const_char_*,_franca::SkipGrammar,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_boost::spirit::unused_type,_boost::spirit::unused_type>_&,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_&>,_0L>_>,_2L>_&>,_2L>
              *)local_2a68);
  local_2abb = (bool_<false>)0x5e;
  boost::spirit::terminal<boost::spirit::tag::lit>::operator()
            ((terminal<boost::spirit::tag::lit> *)&local_2aba,&boost::spirit::lit,&local_2abb);
  local_2ab8.child0 = &local_2aba;
  local_2ad3 = (bool_<false>)0x5f;
  local_1bd8 = local_2ab8.child0;
  that_75.child0 = local_2ab8.child0;
  boost::spirit::
  terminal<boost::spirit::tag::char_code<boost::spirit::tag::char_,boost::spirit::char_encoding::standard>>
  ::operator()(&local_2ad2,&boost::spirit::standard::char_,&local_2ad3);
  local_2ad0.child1 = &local_2ad2;
  local_2ad0.child0 = (proto_child0)&boost::spirit::standard::alpha;
  local_2ab0.child0 = &local_2ab8;
  local_2ab0.child1 = &local_2ad0;
  local_2af3 = (bool_<false>)0x5f;
  boost::spirit::
  terminal<boost::spirit::tag::char_code<boost::spirit::tag::char_,boost::spirit::char_encoding::standard>>
  ::operator()(&local_2af2,&boost::spirit::standard::char_,&local_2af3);
  local_2af0.child1 = &local_2af2;
  local_2af0.child0 = (proto_child0)&boost::spirit::standard::alnum;
  local_2ae0.child0 = &local_2af0;
  local_2aa0.child0 = &local_2ab0;
  local_2aa0.child1 = &local_2ae0;
  local_2a90.child1 = &local_2aa0;
  local_10 = &local_21;
  local_2a90.child0 = (proto_child0)&boost::spirit::lexeme;
  local_20 = local_2a90.child1;
  local_18 = local_2a90.child1;
  boost::spirit::qi::operator%=(&this->id_,&local_2a90);
  return;
}

Assistant:

TypeDefinitionParser::TypeDefinitionParser() :
		TypeDefinitionParser::base_type(type_definition_)
{
	namespace qi = boost::spirit::qi;

	type_definition_
		%= array_type_
		| enumeration_type_
		| struct_type_
		| union_type_
		| map_type_
		| alias_type_
		;

	array_type_
		%= "array"
		> id_
		> "of"
		> type_
		;

	alias_type_
		%= "typedef"
		> id_
		> "is"
		> type_
		;

	enumeration_type_
		%= "enumeration"
		> id_
		> -("extends" > fqn_)
		> '{'
		> *enumerator_
		> '}'
		;

	struct_type_
		%= "struct"
		> id_
		> -("extends" > fqn_)
		> qi::matches["polymorphic"]
		> '{'
		> *field_
		> '}'
		;

	union_type_
		%= "union"
		> id_
		> -("extends" > fqn_)
		> '{'
		> *field_
		> '}'
		;

	map_type_
		%= "map"
		> id_
		> '{'
		> type_
		> "to"
		> type_
		> '}'
		;

	field_
		%= type_
		> qi::matches[qi::lit('[') > qi::lit(']')]
		> id_
		;

	enumerator_
		%= id_
		>> -('=' > expression_)
		;

	fqn_
		%= qi::raw[id_ % '.']
		;

	id_
		%= qi::lexeme[-qi::lit('^') >> (qi::alpha | qi::char_('_')) >> *(qi::alnum | qi::char_('_'))]
		;
}